

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

void pnga_sprs_array_export(Integer s_a,char *file)

{
  long lVar1;
  size_t __size;
  uint uVar2;
  int iVar3;
  Integer IVar4;
  long lVar5;
  _sparse_array *p_Var6;
  _sparse_array *p_Var7;
  int iVar8;
  Integer IVar9;
  Integer n;
  void *x;
  long lVar10;
  char *pcVar11;
  FILE *__stream;
  void *pvVar12;
  void *buf;
  void *buf_00;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  char op [2];
  int local_130;
  Integer hi;
  void *local_110;
  void *local_108;
  void *local_100;
  void *local_f8;
  Integer lo;
  long local_e8;
  undefined4 *local_e0;
  char frmt [32];
  int *idx;
  Integer ld;
  int local_84;
  long local_80;
  long local_78;
  Integer local_70;
  long local_68;
  void *local_60;
  long local_58;
  ulong local_50;
  long local_48;
  Integer jhi;
  Integer jlo;
  
  lVar1 = s_a + 1000;
  IVar4 = SPA[lVar1].size;
  uVar2 = (uint)SPA[lVar1].type;
  iVar3 = (int)SPA[lVar1].idx_size;
  local_70 = s_a;
  IVar9 = pnga_pgroup_nodeid(SPA[lVar1].grp);
  n = pnga_pgroup_nnodes(SPA[lVar1].grp);
  bVar21 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar21) {
    pnga_pgroup_sync(SPA[lVar1].grp);
  }
  lVar20 = 0;
  local_e8 = 0;
  if (0 < n) {
    local_e8 = n;
  }
  for (lVar15 = 0; local_e8 != lVar15; lVar15 = lVar15 + 1) {
    pnga_distribution(SPA[lVar1].g_data,lVar15,&lo,&hi);
    if (lVar20 < hi) {
      lVar20 = hi;
    }
  }
  __size = n * 4;
  local_108 = malloc(__size);
  local_110 = malloc(__size);
  x = malloc(__size);
  pvVar12 = local_110;
  for (lVar15 = 0; p_Var7 = SPA, local_e8 != lVar15; lVar15 = lVar15 + 1) {
    *(undefined4 *)((long)local_108 + lVar15 * 4) = 0;
    *(undefined4 *)((long)local_110 + lVar15 * 4) = 0;
    *(undefined4 *)((long)x + lVar15 * 4) = 0;
  }
  *(int *)((long)local_108 + IVar9 * 4) = (int)SPA[lVar1].ilo;
  *(int *)((long)local_110 + IVar9 * 4) = (int)p_Var7[lVar1].ihi;
  *(int *)((long)x + IVar9 * 4) = (int)p_Var7[lVar1].nblocks;
  op[0] = '+';
  op[1] = '\0';
  pnga_pgroup_gop(p_Var7[lVar1].grp,0x3e9,local_108,n,op);
  pnga_pgroup_gop(SPA[lVar1].grp,0x3e9,pvVar12,n,op);
  pnga_pgroup_gop(SPA[lVar1].grp,0x3e9,x,n,op);
  local_e0 = (undefined4 *)malloc(__size);
  lVar17 = 0;
  for (lVar15 = 0; local_e8 != lVar15; lVar15 = lVar15 + 1) {
    lVar17 = lVar17 + *(int *)((long)x + lVar15 * 4);
  }
  local_f8 = malloc(lVar17 * 4);
  local_100 = malloc(lVar17 * 4);
  *local_e0 = 0;
  iVar13 = 0;
  for (lVar15 = 1; lVar15 < n; lVar15 = lVar15 + 1) {
    iVar13 = iVar13 + *(int *)((long)x + lVar15 * 4 + -4);
    local_e0[lVar15] = iVar13;
  }
  lVar10 = 0;
  lVar15 = 0;
  if (0 < lVar17) {
    lVar15 = lVar17;
  }
  for (; p_Var7 = SPA, lVar15 != lVar10; lVar10 = lVar10 + 1) {
    *(undefined4 *)((long)local_f8 + lVar10 * 4) = 0;
    *(undefined4 *)((long)local_100 + lVar10 * 4) = 0;
  }
  uVar14 = *(uint *)((long)x + IVar9 * 4);
  p_Var6 = SPA + lVar1;
  uVar16 = 0;
  uVar18 = (ulong)uVar14;
  if ((int)uVar14 < 1) {
    uVar18 = uVar16;
  }
  for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
    iVar13 = local_e0[IVar9];
    *(int *)((long)local_f8 + uVar16 * 4 + (long)iVar13 * 4) = (int)p_Var6->blkidx[uVar16];
    *(int *)((long)local_100 + uVar16 * 4 + (long)iVar13 * 4) = (int)p_Var7[lVar1].blksize[uVar16];
  }
  pnga_pgroup_gop(p_Var7[lVar1].grp,0x3e9,local_f8,lVar17,op);
  pnga_pgroup_gop(SPA[lVar1].grp,0x3e9,local_100,lVar17,op);
  if (iVar3 == 4) {
    builtin_strncpy(frmt,"%d %d",5);
    lVar15 = 5;
  }
  else {
    lVar15 = 7;
    builtin_strncpy(frmt,"%ld %ld",7);
  }
  uVar14 = (uint)lVar15;
  pcVar11 = frmt + lVar15;
  if (uVar2 - 0x3eb < 2) {
    builtin_strncpy(frmt + lVar15," %14.6e",7);
    uVar14 = 7;
  }
  else if (uVar2 == 0x3ea) {
    builtin_strncpy(frmt + lVar15," %ld",4);
    uVar14 = 4;
  }
  else if (uVar2 == 0x3e9) {
    frmt[lVar15 + 2] = 'd';
    pcVar11[0] = ' ';
    pcVar11[1] = '%';
    uVar14 = 3;
  }
  else if ((uVar2 & 0xfffffffe) == 0x3ee) {
    builtin_strncpy(frmt + lVar15," %14.6e %14.6e",0xe);
    uVar14 = 0xe;
  }
  (pcVar11 + uVar14)[0] = '\n';
  (pcVar11 + uVar14)[1] = '\0';
  if (IVar9 == 0) {
    __stream = fopen(file,"w");
    fprintf(__stream,"%%MatrixMarket matrix coordinate real general\n");
    fprintf(__stream,"%ld %ld %ld\n",SPA[lVar1].idim,SPA[lVar1].jdim,lVar20);
    local_130 = (int)IVar4;
    local_78 = (long)local_130;
    local_80 = (long)iVar3;
    for (lVar20 = 0; lVar20 != local_e8; lVar20 = lVar20 + 1) {
      ld = 1;
      pnga_distribution(SPA[lVar1].g_data,lVar20,&lo,&hi);
      pvVar12 = malloc(((hi - lo) + 1) * local_78);
      pnga_get(SPA[lVar1].g_data,&lo,&hi,pvVar12,&ld);
      pnga_distribution(SPA[lVar1].g_i,lVar20,&lo,&hi);
      lVar15 = local_80;
      buf = malloc(((hi - lo) + 1) * local_80);
      pnga_get(SPA[lVar1].g_i,&lo,&hi,buf,&ld);
      pnga_distribution(SPA[lVar1].g_j,lVar20,&lo,&hi);
      buf_00 = malloc(((hi - lo) + 1) * lVar15);
      pnga_get(SPA[lVar1].g_j,&lo,&hi,buf_00,&ld);
      uVar14 = *(uint *)((long)x + lVar20 * 4);
      iVar13 = *(int *)((long)local_110 + lVar20 * 4);
      iVar8 = *(int *)((long)local_108 + lVar20 * 4);
      local_68 = (long)((iVar13 - iVar8) + 2);
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      local_50 = (ulong)uVar14;
      lVar15 = 0;
      local_60 = pvVar12;
      while (lVar15 < (iVar13 - iVar8) + 1) {
        lVar17 = lVar15 + iVar8 + 1;
        iVar13 = 0;
        local_58 = lVar15;
        for (uVar18 = 0; lVar15 = local_58, uVar18 != local_50; uVar18 = uVar18 + 1) {
          local_48 = (long)(int)uVar18 + (long)(int)local_e0[lVar20];
          pnga_sprs_array_column_distribution
                    (local_70,(long)*(int *)((long)local_f8 + local_48 * 4),&jlo,&jhi);
          lVar15 = uVar18 * local_68 + lVar15;
          lVar10 = (long)iVar13;
          local_84 = iVar13;
          if (iVar3 == 4) {
            lVar19 = (long)*(int *)((long)buf + lVar15 * 4);
            iVar13 = *(int *)((long)buf + lVar15 * 4 + 4);
            uVar16 = lVar19 << 4 | 8;
            for (; lVar19 < iVar13; lVar19 = lVar19 + 1) {
              if (uVar2 == 0x3eb) {
                iVar8 = *(int *)((long)buf_00 + lVar19 * 4 + lVar10 * 4);
                dVar22 = (double)*(float *)((long)pvVar12 + lVar19 * 4 + lVar10 * 4);
LAB_00144b1f:
                fprintf(__stream,frmt,dVar22,lVar17,(ulong)(iVar8 + 1));
                goto switchD_00144b59_caseD_3eb;
              }
              if (uVar2 == 0x3ec) {
                dVar22 = *(double *)((long)pvVar12 + lVar19 * 8 + lVar10 * 8);
                iVar8 = *(int *)((long)buf_00 + lVar19 * 4 + lVar10 * 4);
                goto LAB_00144b1f;
              }
              switch(uVar2) {
              case 0x3e9:
                fprintf(__stream,frmt,lVar17,
                        (ulong)(*(int *)((long)buf_00 + lVar19 * 4 + lVar10 * 4) + 1),
                        (ulong)*(uint *)((long)pvVar12 + lVar19 * 4 + lVar10 * 4));
                break;
              case 0x3ea:
                fprintf(__stream,frmt,lVar17,
                        (ulong)(*(int *)((long)buf_00 + lVar19 * 4 + lVar10 * 4) + 1),
                        *(undefined8 *)((long)pvVar12 + lVar19 * 8 + lVar10 * 8));
                break;
              case 0x3ee:
                iVar8 = *(int *)((long)buf_00 + lVar19 * 4 + lVar10 * 4);
                dVar22 = (double)*(float *)((long)pvVar12 + lVar19 * 8 + lVar10 * 4);
                dVar23 = (double)*(float *)((long)pvVar12 + lVar19 * 8 + lVar10 * 4 + 4);
                goto LAB_00144bd4;
              case 0x3ef:
                dVar22 = *(double *)((long)pvVar12 + uVar16 + lVar10 * 8 + -8);
                dVar23 = *(double *)((long)pvVar12 + uVar16 + lVar10 * 8);
                iVar8 = *(int *)((long)buf_00 + lVar19 * 4 + lVar10 * 4);
LAB_00144bd4:
                fprintf(__stream,frmt,dVar22,dVar23,lVar17,(ulong)(iVar8 + 1));
              }
switchD_00144b59_caseD_3eb:
              uVar16 = uVar16 + 0x10;
            }
          }
          else {
            lVar19 = *(long *)((long)buf + lVar15 * 8);
            lVar15 = *(long *)((long)buf + lVar15 * 8 + 8);
            uVar16 = lVar19 << 4 | 8;
            for (; lVar19 < lVar15; lVar19 = lVar19 + 1) {
              if (uVar2 == 0x3eb) {
                lVar5 = *(long *)((long)buf_00 + lVar19 * 8 + lVar10 * 8);
                dVar22 = (double)*(float *)((long)pvVar12 + lVar19 * 4 + lVar10 * 4);
LAB_00144c59:
                fprintf(__stream,frmt,dVar22,lVar17,lVar5 + 1);
                goto switchD_00144c93_caseD_3eb;
              }
              if (uVar2 == 0x3ec) {
                dVar22 = *(double *)((long)pvVar12 + lVar19 * 8 + lVar10 * 8);
                lVar5 = *(long *)((long)buf_00 + lVar19 * 8 + lVar10 * 8);
                goto LAB_00144c59;
              }
              switch(uVar2) {
              case 0x3e9:
                fprintf(__stream,frmt,lVar17,*(long *)((long)buf_00 + lVar19 * 8 + lVar10 * 8) + 1,
                        (ulong)*(uint *)((long)pvVar12 + lVar19 * 4 + lVar10 * 4));
                break;
              case 0x3ea:
                fprintf(__stream,frmt,lVar17,*(long *)((long)buf_00 + lVar19 * 8 + lVar10 * 8) + 1,
                        *(undefined8 *)((long)pvVar12 + lVar19 * 8 + lVar10 * 8));
                break;
              case 0x3ee:
                lVar5 = *(long *)((long)buf_00 + lVar19 * 8 + lVar10 * 8);
                dVar22 = (double)*(float *)((long)pvVar12 + lVar19 * 8 + lVar10 * 4);
                dVar23 = (double)*(float *)((long)pvVar12 + lVar19 * 8 + lVar10 * 4 + 4);
                goto LAB_00144d12;
              case 0x3ef:
                dVar22 = *(double *)((long)pvVar12 + uVar16 + lVar10 * 8 + -8);
                dVar23 = *(double *)((long)pvVar12 + uVar16 + lVar10 * 8);
                lVar5 = *(long *)((long)buf_00 + lVar19 * 8 + lVar10 * 8);
LAB_00144d12:
                fprintf(__stream,frmt,dVar22,dVar23,lVar17,lVar5 + 1);
              }
switchD_00144c93_caseD_3eb:
              uVar16 = uVar16 + 0x10;
            }
          }
          iVar13 = local_84 + *(int *)((long)local_100 + local_48 * 4);
          pvVar12 = local_60;
        }
        iVar13 = *(int *)((long)local_110 + lVar20 * 4);
        iVar8 = *(int *)((long)local_108 + lVar20 * 4);
        lVar15 = local_58 + 1;
      }
      free(pvVar12);
      free(buf_00);
      free(buf);
    }
    fclose(__stream);
  }
  free(local_108);
  free(local_110);
  free(x);
  free(local_f8);
  free(local_100);
  pnga_pgroup_sync(SPA[lVar1].grp);
  return;
}

Assistant:

void pnga_sprs_array_export(Integer s_a, const char* file)
{
  Integer hdl = GA_OFFSET + s_a;
  int size  = SPA[hdl].size;
  int type = SPA[hdl].type;
  int local_sync_begin,local_sync_end;
  char frmt[32];
  char *cptr;
  int offset;
  Integer nlen_data;
  Integer nlen_j;
  Integer nlen_i;
  Integer irow;
  int idx_size = SPA[hdl].idx_size;
  void *vptr;
  void *iptr;
  void *jptr;
  Integer lo, hi, ld;
  char op[2];
  FILE *SPRS;
  int *ilo, *ihi, *nblock;
  Integer me = pnga_pgroup_nodeid(SPA[hdl].grp);
  Integer nprocs = pnga_pgroup_nnodes(SPA[hdl].grp);
  Integer iproc, iblock;
  Integer nblocks;
  int *istart;
  int icnt;
  Integer g_blks;
  Integer one = 1;
  Integer total;
  int *blkmap;
  int *blkoffset;
  int *blksize;
  int64_t nnz;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[hdl].grp);

  /* find the total number of nonzero elements on each process */
  nnz = 0;
  for (iproc = 0; iproc<nprocs; iproc++) {
    pnga_distribution(SPA[hdl].g_data,iproc,&lo,&hi);
    if (hi > nnz) nnz = hi;
  }

  /* find low and hi row indices on each processor */
  ilo = (int*)malloc(nprocs*sizeof(int));
  ihi = (int*)malloc(nprocs*sizeof(int));
  nblock = (int*)malloc(nprocs*sizeof(int));
  for (iproc=0; iproc<nprocs; iproc++) {
    ilo[iproc] = 0;
    ihi[iproc] = 0;
    nblock[iproc] = 0;
  }
  ilo[me] = (int)SPA[hdl].ilo;
  ihi[me] = (int)SPA[hdl].ihi;
  nblock[me] = (int)SPA[hdl].nblocks;
  op[0] = '+';
  op[1] = '\0';
  pnga_pgroup_gop(SPA[hdl].grp,C_INT,ilo,nprocs,op);
  pnga_pgroup_gop(SPA[hdl].grp,C_INT,ihi,nprocs,op);
  pnga_pgroup_gop(SPA[hdl].grp,C_INT,nblock,nprocs,op);
  /* construct a map of all blocks */
  nblocks = 0;
  blkoffset = (int*)malloc(nprocs*sizeof(int));
  for (iproc=0; iproc<nprocs; iproc++) nblocks += nblock[iproc];
  blkmap = (int*)malloc(nblocks*sizeof(int));
  blksize = (int*)malloc(nblocks*sizeof(int));
  blkoffset[0] = 0;
  for (iproc=1; iproc<nprocs; iproc++) {
    blkoffset[iproc] = blkoffset[iproc-1]+nblock[iproc-1];
  }
  for (iproc=0; iproc<nblocks; iproc++) {
    blkmap[iproc] = 0;
    blksize[iproc] = 0;
  }
  for (iproc=0; iproc<nblock[me]; iproc++) {
    blkmap[iproc+blkoffset[me]] = SPA[hdl].blkidx[iproc];
    blksize[iproc+blkoffset[me]] = SPA[hdl].blksize[iproc];
  }
  pnga_pgroup_gop(SPA[hdl].grp,C_INT,blkmap,nblocks,op);
  pnga_pgroup_gop(SPA[hdl].grp,C_INT,blksize,nblocks,op);
  /* format print statement */
  if (idx_size == 4) {
    strncpy(frmt,"\%d \%d",5);
    offset = 5;
  } else {
    strncpy(frmt,"\%ld \%ld",7);
    offset = 7;
  }
  cptr = frmt+offset;
  if (type == C_FLOAT || type == C_DBL) {
    strncpy(cptr," \%14.6e",7);
    offset = 7;
  } else if (type == C_INT) {
    strncpy(cptr," \%d",3);
    offset = 3;
  } else if (type == C_LONG) {
    strncpy(cptr," \%ld",4);
    offset = 4;
  } else if (type == C_SCPL || type == C_DCPL) {
    strncpy(cptr," \%14.6e \%14.6e",14);
    offset = 14;
  } 
  cptr += offset;
  cptr[0] = '\n';
  cptr++;
  cptr[0] = '\0';

  if (me == 0) {
    /* open file */
    SPRS = fopen(file,"w");
    fprintf(SPRS,"\%\%MatrixMarket matrix coordinate real general\n");
    fprintf(SPRS,"%ld %ld %ld\n",SPA[hdl].idim, SPA[hdl].jdim, nnz);
    /* Loop over all row blocks */
    for (iproc = 0; iproc<nprocs; iproc++) {
      /* find out how much data is on each process, allocate
       * local buffers to hold it and copy data to local buffer */
      /* Copy data from global arrays to local buffers */
      Integer iilo, iihi, istride, ioffset, itop;
      int ibl;
      ld = 1;
      pnga_distribution(SPA[hdl].g_data, iproc, &lo, &hi);
      nlen_data = hi-lo+1;
      vptr = malloc(nlen_data*size);
      pnga_get(SPA[hdl].g_data,&lo,&hi,vptr,&ld);

      pnga_distribution(SPA[hdl].g_i, iproc, &lo, &hi);
      nlen_i = hi-lo+1;
      iptr = malloc(nlen_i*idx_size);
      pnga_get(SPA[hdl].g_i,&lo,&hi,iptr,&ld);

      pnga_distribution(SPA[hdl].g_j, iproc, &lo, &hi);
      nlen_j = hi-lo+1;
      jptr = malloc(nlen_j*idx_size);
      pnga_get(SPA[hdl].g_j,&lo,&hi,jptr,&ld);

      nblocks = nblock[iproc];
      /* loop over rows. Not the most efficient way of printing out information
       * but makes output slightly neater */
      istride = ihi[iproc]-ilo[iproc]+2;
      for (irow = 0; irow<(ihi[iproc]-ilo[iproc]+1); irow++) {
        int loffset = 0;
        iilo = irow+ilo[iproc];
        for (ibl = 0; ibl<nblocks; ibl++) {
          Integer j, k;
          Integer jlo, jhi, nblk;
          nblk = (Integer)blkmap[blkoffset[iproc]+ibl];
          pnga_sprs_array_column_distribution(s_a,nblk,&jlo,&jhi);
          ioffset = ibl*istride+irow;
          if (idx_size == 4) {
            int *idx = (int*)iptr;
            int *jdx = (int*)jptr+loffset;
            int tlo = idx[ioffset];
            int thi = idx[ioffset+1];
            for (k=tlo; k<thi; k++) {
              if (type == C_FLOAT) {
                float val = ((float*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_DBL) {
                double val = ((double*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_INT) {
                int val = ((int*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_LONG) {
                int64_t val = ((int64_t*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_SCPL) {
                float rval = ((float*)vptr)[2*k+loffset];
                float ival = ((float*)vptr)[2*k+1+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,rval,ival);
              } else if (type == C_DCPL) {
                double rval = ((double*)vptr)[2*k+loffset];
                double ival = ((double*)vptr)[2*k+1+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,rval,ival);
              }
            }
          } else {
            int64_t *idx = (int64_t*)iptr;
            int64_t *jdx = (int64_t*)jptr+loffset;
            int64_t tlo = idx[ioffset];
            int64_t thi = idx[ioffset+1];
            for (k=tlo; k<thi; k++) {
              if (type == C_FLOAT) {
                float val = ((float*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_DBL) {
                double val = ((double*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_INT) {
                int val = ((int*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_LONG) {
                int64_t val = ((int64_t*)vptr)[k+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,val);
              } else if (type == C_SCPL) {
                float rval = ((float*)vptr)[2*k+loffset];
                float ival = ((float*)vptr)[2*k+1+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,rval,ival);
              } else if (type == C_DCPL) {
                double rval = ((double*)vptr)[2*k+loffset];
                double ival = ((double*)vptr)[2*k+1+loffset];
                fprintf(SPRS,frmt,iilo+1,jdx[k]+1,rval,ival);
              }
            }
          }
          loffset += blksize[blkoffset[iproc]+ibl];
        }
      }
      /* free local buffers */
      free(vptr);
      free(jptr);
      free(iptr);
    }
    fclose(SPRS);
  }
  free(ilo);
  free(ihi);
  free(nblock);
  free(blkmap);
  free(blksize);
  pnga_pgroup_sync(SPA[hdl].grp);
}